

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Version.cpp
# Opt level: O0

void __thiscall aiScene::~aiScene(aiScene *this)

{
  aiNode *this_00;
  aiMesh *this_01;
  aiMaterial *this_02;
  aiAnimation *this_03;
  aiTexture *this_04;
  uint local_28;
  uint local_24;
  uint a_5;
  uint a_4;
  uint a_3;
  uint a_2;
  uint a_1;
  uint a;
  aiScene *this_local;
  
  this_00 = this->mRootNode;
  if (this_00 != (aiNode *)0x0) {
    aiNode::~aiNode(this_00);
    operator_delete(this_00);
  }
  if ((this->mNumMeshes != 0) && (this->mMeshes != (aiMesh **)0x0)) {
    for (a_2 = 0; a_2 < this->mNumMeshes; a_2 = a_2 + 1) {
      this_01 = this->mMeshes[a_2];
      if (this_01 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(this_01);
        operator_delete(this_01);
      }
    }
  }
  if (this->mMeshes != (aiMesh **)0x0) {
    operator_delete__(this->mMeshes);
  }
  if ((this->mNumMaterials != 0) && (this->mMaterials != (aiMaterial **)0x0)) {
    for (a_3 = 0; a_3 < this->mNumMaterials; a_3 = a_3 + 1) {
      this_02 = this->mMaterials[a_3];
      if (this_02 != (aiMaterial *)0x0) {
        aiMaterial::~aiMaterial(this_02);
        operator_delete(this_02);
      }
    }
  }
  if (this->mMaterials != (aiMaterial **)0x0) {
    operator_delete__(this->mMaterials);
  }
  if ((this->mNumAnimations != 0) && (this->mAnimations != (aiAnimation **)0x0)) {
    for (a_4 = 0; a_4 < this->mNumAnimations; a_4 = a_4 + 1) {
      this_03 = this->mAnimations[a_4];
      if (this_03 != (aiAnimation *)0x0) {
        aiAnimation::~aiAnimation(this_03);
        operator_delete(this_03);
      }
    }
  }
  if (this->mAnimations != (aiAnimation **)0x0) {
    operator_delete__(this->mAnimations);
  }
  if ((this->mNumTextures != 0) && (this->mTextures != (aiTexture **)0x0)) {
    for (a_5 = 0; a_5 < this->mNumTextures; a_5 = a_5 + 1) {
      this_04 = this->mTextures[a_5];
      if (this_04 != (aiTexture *)0x0) {
        aiTexture::~aiTexture(this_04);
        operator_delete(this_04);
      }
    }
  }
  if (this->mTextures != (aiTexture **)0x0) {
    operator_delete__(this->mTextures);
  }
  if ((this->mNumLights != 0) && (this->mLights != (aiLight **)0x0)) {
    for (local_24 = 0; local_24 < this->mNumLights; local_24 = local_24 + 1) {
      if (this->mLights[local_24] != (aiLight *)0x0) {
        operator_delete(this->mLights[local_24]);
      }
    }
  }
  if (this->mLights != (aiLight **)0x0) {
    operator_delete__(this->mLights);
  }
  if ((this->mNumCameras != 0) && (this->mCameras != (aiCamera **)0x0)) {
    for (local_28 = 0; local_28 < this->mNumCameras; local_28 = local_28 + 1) {
      if (this->mCameras[local_28] != (aiCamera *)0x0) {
        operator_delete(this->mCameras[local_28]);
      }
    }
  }
  if (this->mCameras != (aiCamera **)0x0) {
    operator_delete__(this->mCameras);
  }
  aiMetadata::Dealloc(this->mMetaData);
  this->mMetaData = (aiMetadata *)0x0;
  if (this->mPrivate != (void *)0x0) {
    operator_delete(this->mPrivate);
  }
  return;
}

Assistant:

ASSIMP_API aiScene::~aiScene() {
    // delete all sub-objects recursively
    delete mRootNode;

    // To make sure we won't crash if the data is invalid it's
    // much better to check whether both mNumXXX and mXXX are
    // valid instead of relying on just one of them.
    if (mNumMeshes && mMeshes)
        for( unsigned int a = 0; a < mNumMeshes; a++)
            delete mMeshes[a];
    delete [] mMeshes;

    if (mNumMaterials && mMaterials) {
        for (unsigned int a = 0; a < mNumMaterials; ++a ) {
            delete mMaterials[ a ];
        }
    }
    delete [] mMaterials;

    if (mNumAnimations && mAnimations)
        for( unsigned int a = 0; a < mNumAnimations; a++)
            delete mAnimations[a];
    delete [] mAnimations;

    if (mNumTextures && mTextures)
        for( unsigned int a = 0; a < mNumTextures; a++)
            delete mTextures[a];
    delete [] mTextures;

    if (mNumLights && mLights)
        for( unsigned int a = 0; a < mNumLights; a++)
            delete mLights[a];
    delete [] mLights;

    if (mNumCameras && mCameras)
        for( unsigned int a = 0; a < mNumCameras; a++)
            delete mCameras[a];
    delete [] mCameras;

    aiMetadata::Dealloc(mMetaData);
    mMetaData = nullptr;

    delete static_cast<Assimp::ScenePrivateData*>( mPrivate );
}